

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.c
# Opt level: O0

void * kmpc_aligned_malloc(size_t size,size_t alignment)

{
  int *piVar1;
  void *pvVar2;
  ulong in_RSI;
  void *ptr_allocated;
  void *ptr;
  bufsize in_stack_00000050;
  kmp_info_t *in_stack_00000058;
  void *local_20;
  void *local_8;
  
  if ((in_RSI & in_RSI - 1) == 0) {
    __kmp_entry_thread();
    pvVar2 = bget(in_stack_00000058,in_stack_00000050);
    if (pvVar2 == (void *)0x0) {
      local_20 = (void *)0x0;
    }
    else {
      local_20 = (void *)((long)pvVar2 + in_RSI + 8 & (in_RSI - 1 ^ 0xffffffffffffffff));
      *(void **)((long)local_20 - 8) = pvVar2;
    }
    local_8 = local_20;
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

void *
kmpc_aligned_malloc( size_t size, size_t alignment )
{
    void * ptr;
    void * ptr_allocated;
    KMP_DEBUG_ASSERT( alignment < 32 * 1024 ); // Alignment should not be too big
    if( !IS_POWER_OF_TWO(alignment) ) {
        // AC: do we need to issue a warning here?
        errno = EINVAL;
        return NULL;
    }
    size = size + sizeof( void* ) + alignment;
    ptr_allocated = bget( __kmp_entry_thread(), (bufsize)size );
    if( ptr_allocated != NULL ) {
        // save allocated pointer just before one returned to user
        ptr = (void*)(((kmp_uintptr_t)ptr_allocated + sizeof( void* ) + alignment) & ~(alignment - 1));
        *((void**)ptr - 1) = ptr_allocated;
    } else {
        ptr = NULL;
    }
    return ptr;
}